

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::updateSimplexOptions(HEkk *this)

{
  HighsOptions *pHVar1;
  
  pHVar1 = this->options_;
  (this->info_).dual_simplex_cost_perturbation_multiplier =
       (pHVar1->super_HighsOptionsStruct).dual_simplex_cost_perturbation_multiplier;
  (this->info_).primal_simplex_bound_perturbation_multiplier =
       (pHVar1->super_HighsOptionsStruct).primal_simplex_bound_perturbation_multiplier;
  return;
}

Assistant:

void HEkk::updateSimplexOptions() {
  // Update some simplex option values from HighsOptions when
  // (re-)solving an LP. Others aren't changed because better values
  // may have been learned due to solving this LP (possibly with some
  // modification) before.
  //
  // NB simplex_strategy is set by chooseSimplexStrategyThreads in each call
  //
  info_.dual_simplex_cost_perturbation_multiplier =
      options_->dual_simplex_cost_perturbation_multiplier;
  info_.primal_simplex_bound_perturbation_multiplier =
      options_->primal_simplex_bound_perturbation_multiplier;
}